

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O0

void tommy_hashdyn_init(tommy_hashdyn *hashdyn)

{
  long lVar1;
  tommy_hashdyn_node **pptVar2;
  long in_FS_OFFSET;
  tommy_hashdyn *hashdyn_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hashdyn->bucket_bit = 4;
  hashdyn->bucket_max = 1 << ((byte)hashdyn->bucket_bit & 0x1f);
  hashdyn->bucket_mask = hashdyn->bucket_max - 1;
  pptVar2 = (tommy_hashdyn_node **)lrtr_calloc((ulong)hashdyn->bucket_max,8);
  hashdyn->bucket = pptVar2;
  hashdyn->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashdyn_init(tommy_hashdyn* hashdyn)
{
	/* fixed initial size */
	hashdyn->bucket_bit = TOMMY_HASHDYN_BIT;
	hashdyn->bucket_max = 1 << hashdyn->bucket_bit;
	hashdyn->bucket_mask = hashdyn->bucket_max - 1;
	hashdyn->bucket = tommy_cast(tommy_hashdyn_node**, tommy_calloc(hashdyn->bucket_max, sizeof(tommy_hashdyn_node*)));

	hashdyn->count = 0;
}